

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

void __thiscall SslTcpSocketImpl::Close(SslTcpSocketImpl *this)

{
  mutex *__mutex;
  deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long>_>_>
  *this_00;
  atomic<unsigned_long> *paVar1;
  SslConnection *this_01;
  int iVar2;
  size_t sVar3;
  SSL *__val;
  wchar_t *pwVar4;
  bool bVar5;
  __array temp;
  unique_lock<std::mutex> lock;
  size_t len;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a0;
  unique_lock<std::mutex> local_80;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  wstring local_50;
  
  this->m_bCloseReq = true;
  iVar2 = (*(this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[8])();
  if ((iVar2 == 0) &&
     (this_01 = (this->m_pSslCon)._M_t.
                super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                ._M_t.
                super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
     this_01 != (SslConnection *)0x0)) {
    iVar2 = OpenSSLWrapper::SslConnection::SSLGetShutdown(this_01);
    if (iVar2 < 1) {
      std::unique_lock<std::mutex>::unique_lock(&local_80,&this->m_mxEnDecode);
      sVar3 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                        ((this->m_pSslCon)._M_t.
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                        );
      __mutex = &(this->super_TcpSocketImpl).m_mxOutDeque;
      this_00 = &(this->super_TcpSocketImpl).m_quOutData;
      bVar5 = false;
      while (sVar3 != 0) {
        __val = OpenSSLWrapper::SslConnection::operator()
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        std::__cxx11::to_wstring(&local_50,(unsigned_long)__val);
        std::operator+(&local_70,L"SslGetOutDataSize unexpected full: ",&local_50);
        std::operator+(&local_a0,&local_70,L"\r\n");
        OutputDebugString(local_a0._M_dataplus._M_p);
        std::__cxx11::wstring::~wstring((wstring *)&local_a0);
        std::__cxx11::wstring::~wstring((wstring *)&local_70);
        std::__cxx11::wstring::~wstring((wstring *)&local_50);
        pwVar4 = (wchar_t *)operator_new__(sVar3);
        memset(pwVar4,0,sVar3);
        local_a0._M_dataplus._M_p = pwVar4;
        local_70._M_dataplus._M_p =
             (pointer)OpenSSLWrapper::SslConnection::SslGetOutData
                                ((this->m_pSslCon)._M_t.
                                 super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                 .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                 _M_head_impl,(uint8_t *)pwVar4,sVar3);
        if (local_70._M_dataplus._M_p != (pointer)0x0) {
          std::mutex::lock(__mutex);
          LOCK();
          paVar1 = &(this->super_TcpSocketImpl).m_atOutBytes;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i + (long)local_70._M_dataplus._M_p;
          UNLOCK();
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&>
                    ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                      *)this_00,
                     (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_a0
                     ,(unsigned_long *)&local_70);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          bVar5 = true;
        }
        sVar3 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_a0);
      }
      std::unique_lock<std::mutex>::unlock(&local_80);
      if (this->m_iSslInit == 1) {
        OpenSSLWrapper::SslConnection::ShutDownConnection
                  ((this->m_pSslCon)._M_t.
                   super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
                   (int *)0x0);
        sVar3 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        while (sVar3 != 0) {
          pwVar4 = (wchar_t *)operator_new__(sVar3);
          memset(pwVar4,0,sVar3);
          local_a0._M_dataplus._M_p = pwVar4;
          local_70._M_dataplus._M_p =
               (pointer)OpenSSLWrapper::SslConnection::SslGetOutData
                                  ((this->m_pSslCon)._M_t.
                                   super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                   .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                                   _M_head_impl,(uint8_t *)pwVar4,sVar3);
          if (local_70._M_dataplus._M_p != (pointer)0x0) {
            LOCK();
            paVar1 = &(this->super_TcpSocketImpl).m_atOutBytes;
            (paVar1->super___atomic_base<unsigned_long>)._M_i =
                 (paVar1->super___atomic_base<unsigned_long>)._M_i + (long)local_70._M_dataplus._M_p
            ;
            UNLOCK();
            bVar5 = true;
            std::
            deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
            ::
            emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&>
                      ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                        *)this_00,
                       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                       &local_a0,(unsigned_long *)&local_70);
          }
          sVar3 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                            ((this->m_pSslCon)._M_t.
                             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                             _M_head_impl);
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_a0
                    );
        }
      }
      if (bVar5) {
        TcpSocketImpl::TriggerWriteThread(&this->super_TcpSocketImpl);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_80);
    }
  }
  TcpSocketImpl::Close(&this->super_TcpSocketImpl);
  return;
}

Assistant:

void SslTcpSocketImpl::Close()
{
    //OutputDebugString(L"SslTcpSocketImpl::Close\r\n");
    m_bCloseReq = true;

    if (GetErrorNo() == 0)  // We get here not because of an error
    {
        if (m_pSslCon != nullptr && m_pSslCon->SSLGetShutdown() < SSL_SENT_SHUTDOWN)
        {
            bool bNewData = false;
            unique_lock<mutex> lock(m_mxEnDecode);
            size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
            while (nOutDataSize > 0)
            {
                OutputDebugString(wstring(L"SslGetOutDataSize unexpected full: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
                auto temp = make_unique<uint8_t[]>(nOutDataSize);
                const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                // Schreibt Daten in die SOCKET
                if (len > 0)
                {
                    m_mxOutDeque.lock();
                    m_atOutBytes += len;
                    m_quOutData.emplace_back(move(temp), len);
                    m_mxOutDeque.unlock();
                    bNewData = true;
                }
                nOutDataSize = m_pSslCon->SslGetOutDataSize();
            }
            lock.unlock();

            if (m_iSslInit == 1)
            {
                m_pSslCon->ShutDownConnection();
                // Get the out Que of the openssl bio, the buffer is already encrypted
                nOutDataSize = m_pSslCon->SslGetOutDataSize();
                while (nOutDataSize > 0)
                {
                    auto temp = make_unique<uint8_t[]>(nOutDataSize);
                    const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                    // Schreibt Daten in die SOCKET
                    if (len > 0)
                    {
                        m_atOutBytes += len;
                        m_quOutData.emplace_back(move(temp), len);
                        bNewData = true;
                    }
                    nOutDataSize = m_pSslCon->SslGetOutDataSize();
                }
            }

            if (bNewData == true)
                TriggerWriteThread();
        }
    }

    TcpSocketImpl::Close();
}